

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

void __thiscall
Lib::
SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
::~SkipList(SkipList<Indexing::LiteralClause,_Indexing::SubstitutionTree<Indexing::LiteralClause>::LDComparator>
            *this)

{
  Node *pNVar1;
  
  pNVar1 = this->_left;
  while (pNVar1->nodes[0] != (Node *)0x0) {
    pop(this);
    pNVar1 = this->_left;
  }
  operator_delete(pNVar1,0x10);
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }